

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.h
# Opt level: O0

void __thiscall slang::ast::Definition::~Definition(Definition *this)

{
  Definition *this_local;
  
  ska::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~flat_hash_set(&this->modports);
  SmallVector<slang::ast::Definition::ParameterDecl,_8UL>::~SmallVector(&this->parameters);
  return;
}

Assistant:

class SLANG_EXPORT Definition {
public:
    struct ParameterDecl {
        union {
            const syntax::ParameterDeclarationSyntax* valueSyntax;
            const syntax::TypeParameterDeclarationSyntax* typeSyntax;
            const Type* givenType;
        };

        union {
            const syntax::DeclaratorSyntax* valueDecl;
            const syntax::TypeAssignmentSyntax* typeDecl;
            const Expression* givenInitializer;
        };

        string_view name;
        SourceLocation location;
        bool isTypeParam;
        bool isLocalParam;
        bool isPortParam;
        bool hasSyntax;

        ParameterDecl(const Scope& scope, const syntax::ParameterDeclarationSyntax& syntax,
                      const syntax::DeclaratorSyntax& decl, bool isLocal, bool isPort);
        ParameterDecl(const Scope& scope, const syntax::TypeParameterDeclarationSyntax& syntax,
                      const syntax::TypeAssignmentSyntax& decl, bool isLocal, bool isPort);
        ParameterDecl(string_view name, SourceLocation location, const Type& givenType,
                      bool isLocal, bool isPort, const Expression* givenInitializer);
        ParameterDecl(string_view name, SourceLocation location, bool isLocal, bool isPort,
                      const Type* defaultType);

        bool hasDefault() const;
    };

    string_view name;
    SourceLocation location;
    const syntax::ModuleDeclarationSyntax& syntax;
    const NetType& defaultNetType;
    const Scope& scope;
    SymbolIndex indexInScope;
    DefinitionKind definitionKind;
    VariableLifetime defaultLifetime;
    UnconnectedDrive unconnectedDrive;
    TimeScale timeScale;
    SmallVector<ParameterDecl, 8> parameters;
    flat_hash_set<string_view> modports;
    span<const AttributeSymbol* const> attributes;
    const syntax::SyntaxTree* syntaxTree;
    bool hasNonAnsiPorts;

    Definition(const Scope& scope, LookupLocation lookupLocation,
               const syntax::ModuleDeclarationSyntax& syntax, const NetType& defaultNetType,
               UnconnectedDrive unconnectedDrive, std::optional<TimeScale> directiveTimeScale,
               const syntax::SyntaxTree* syntaxTree);

    /// Returns a string description of the definition kind, such as "module",
    /// "interface", or "program".
    string_view getKindString() const;

    /// Returns a string description of the definition kind, including an
    /// indefinite article. e.g. "a module", "an interface".
    string_view getArticleKindString() const;

    bool isInstantiated() const { return instantiated; }
    void noteInstantiated() const { instantiated = true; }

    void getHierarchicalPath(std::string& buffer) const;

private:
    mutable bool instantiated = false;
}